

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O3

Slice __thiscall leveldb::anon_unknown_3::TrimSpace(anon_unknown_3 *this,Slice s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  Slice SVar9;
  
  pcVar5 = s.data_;
  if (pcVar5 == (char *)0x0) {
    iVar2 = 0;
    pcVar8 = (char *)0x0;
    iVar1 = 0;
  }
  else {
    pcVar7 = (char *)0x0;
    do {
      iVar1 = isspace((int)(char)this[(long)pcVar7]);
      iVar2 = (int)s.data_;
      if (iVar1 == 0) {
        pcVar8 = pcVar7;
        iVar1 = (int)pcVar7;
        break;
      }
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar5;
      iVar1 = iVar2;
    } while (pcVar5 != pcVar7);
  }
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  iVar6 = iVar2 + 1;
  pcVar7 = (char *)(long)iVar2;
  do {
    iVar2 = iVar3;
    if ((long)pcVar7 <= (long)iVar1) break;
    if (pcVar5 <= pcVar7 + -1) {
      __assert_fail("n < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/include/leveldb/slice.h"
                    ,0x3a,"char leveldb::Slice::operator[](size_t) const");
    }
    iVar4 = isspace((int)(char)(this + -1)[(long)pcVar7]);
    iVar6 = iVar6 + -1;
    pcVar7 = pcVar7 + -1;
    iVar2 = iVar6;
  } while (iVar4 != 0);
  SVar9.size_ = (size_t)(iVar2 - iVar1);
  SVar9.data_ = (char *)(this + (long)pcVar8);
  return SVar9;
}

Assistant:

static Slice TrimSpace(Slice s) {
  int start = 0;
  while (start < s.size() && isspace(s[start])) {
    start++;
  }
  int limit = s.size();
  while (limit > start && isspace(s[limit - 1])) {
    limit--;
  }
  return Slice(s.data() + start, limit - start);
}